

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O2

TiledOutputFile * __thiscall
Imf_2_5::MultiPartOutputFile::getOutputPart<Imf_2_5::TiledOutputFile>
          (MultiPartOutputFile *this,int partNumber)

{
  Data *pDVar1;
  iterator iVar2;
  mapped_type *ppGVar3;
  TiledOutputFile *this_00;
  int partNumber_local;
  Lock local_38;
  pair<int,_Imf_2_5::GenericOutputFile_*> local_28;
  
  local_38._mutex = (Mutex *)this->_data;
  partNumber_local = partNumber;
  std::mutex::lock(local_38._mutex);
  local_38._locked = true;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_Imf_2_5::GenericOutputFile_*>,_std::_Select1st<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
          ::find(&(this->_data->_outputFiles)._M_t,&partNumber_local);
  pDVar1 = this->_data;
  if ((_Rb_tree_header *)iVar2._M_node == &(pDVar1->_outputFiles)._M_t._M_impl.super__Rb_tree_header
     ) {
    this_00 = (TiledOutputFile *)operator_new(0x20);
    TiledOutputFile::TiledOutputFile
              (this_00,(pDVar1->parts).
                       super__Vector_base<Imf_2_5::OutputPartData_*,_std::allocator<Imf_2_5::OutputPartData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[partNumber_local]);
    local_28.first = partNumber_local;
    local_28.second = (GenericOutputFile *)this_00;
    std::
    _Rb_tree<int,std::pair<int_const,Imf_2_5::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericOutputFile*>>>
    ::_M_emplace_unique<std::pair<int,Imf_2_5::GenericOutputFile*>>
              ((_Rb_tree<int,std::pair<int_const,Imf_2_5::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericOutputFile*>>>
                *)&this->_data->_outputFiles,&local_28);
  }
  else {
    ppGVar3 = std::
              map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
              ::operator[](&pDVar1->_outputFiles,&partNumber_local);
    this_00 = (TiledOutputFile *)*ppGVar3;
  }
  IlmThread_2_5::Lock::~Lock(&local_38);
  return this_00;
}

Assistant:

T*
MultiPartOutputFile::getOutputPart(int partNumber)
{
    Lock lock(*_data);
    if (_data->_outputFiles.find(partNumber) == _data->_outputFiles.end())
    {
        T* file = new T(_data->parts[partNumber]);
        _data->_outputFiles.insert(std::make_pair(partNumber, (GenericOutputFile*) file));
        return file;
    }
    else return (T*) _data->_outputFiles[partNumber];
}